

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

void cff_vstore_done(CFF_VStoreRec *vstore,FT_Memory memory)

{
  uint local_1c;
  FT_UInt i;
  FT_Memory memory_local;
  CFF_VStoreRec *vstore_local;
  
  if (vstore->varRegionList != (CFF_VarRegion *)0x0) {
    for (local_1c = 0; local_1c < vstore->regionCount; local_1c = local_1c + 1) {
      ft_mem_free(memory,vstore->varRegionList[local_1c].axisList);
      vstore->varRegionList[local_1c].axisList = (CFF_AxisCoords *)0x0;
    }
  }
  ft_mem_free(memory,vstore->varRegionList);
  vstore->varRegionList = (CFF_VarRegion *)0x0;
  if (vstore->varData != (CFF_VarData *)0x0) {
    for (local_1c = 0; local_1c < vstore->dataCount; local_1c = local_1c + 1) {
      ft_mem_free(memory,vstore->varData[local_1c].regionIndices);
      vstore->varData[local_1c].regionIndices = (FT_UInt *)0x0;
    }
  }
  ft_mem_free(memory,vstore->varData);
  vstore->varData = (CFF_VarData *)0x0;
  return;
}

Assistant:

static void
  cff_vstore_done( CFF_VStoreRec*  vstore,
                   FT_Memory       memory )
  {
    FT_UInt  i;


    /* free regionList and axisLists */
    if ( vstore->varRegionList )
    {
      for ( i = 0; i < vstore->regionCount; i++ )
        FT_FREE( vstore->varRegionList[i].axisList );
    }
    FT_FREE( vstore->varRegionList );

    /* free varData and indices */
    if ( vstore->varData )
    {
      for ( i = 0; i < vstore->dataCount; i++ )
        FT_FREE( vstore->varData[i].regionIndices );
    }
    FT_FREE( vstore->varData );
  }